

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

ON_SubDFace * __thiscall ON_SubDHeap::AllocateFaceAndSetId(ON_SubDHeap *this,uint candidate_face_id)

{
  ON_SubDFace *this_00;
  ON_SubDComponentBase *unused_list;
  ON_SubDFace *local_20;
  
  local_20 = this->m_unused_face;
  this_00 = (ON_SubDFace *)
            Internal_AllocateComponentAndSetId
                      (&this->m_fspf,(ON_SubDComponentBase **)&local_20,&this->m_max_face_id,
                       candidate_face_id);
  this->m_unused_face = local_20;
  if (this_00 != (ON_SubDFace *)0x0) {
    ON_SubDFace::ClearPerFaceColor(this_00);
  }
  return this_00;
}

Assistant:

class ON_SubDFace* ON_SubDHeap::AllocateFaceAndSetId(
  unsigned int candidate_face_id
)
{
  ON_SubDComponentBase* unused_list = m_unused_face;
  ON_SubDFace* f = static_cast<ON_SubDFace*>( ON_SubDHeap::Internal_AllocateComponentAndSetId(
    m_fspf,
    unused_list,
    m_max_face_id,
    candidate_face_id
  ) );
  m_unused_face = static_cast<ON_SubDFace*>(unused_list);
  if (nullptr != f)
    f->ClearPerFaceColor();
  return f;
}